

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

int dogo(int dx,int dy,int dz)

{
  int iVar1;
  
  iflags.autoexplore = '\0';
  iflags.travel1 = '\0';
  flags.travel = '\0';
  flags.run = 2;
  flags.nopick = '\0';
  if (multi == 0) {
    multi = 0x50;
  }
  iVar1 = domove((schar)dx,(schar)dy,(schar)dz);
  flags.nopick = '\0';
  return iVar1;
}

Assistant:

static int do_rush(int dx, int dy, int dz, int runmode, boolean move_only)
{
	int ret;

	iflags.autoexplore = FALSE;
	flags.travel = iflags.travel1 = 0;
	flags.run = runmode;
	
	flags.nopick = move_only;
	
	if (!multi)
	    multi = max(COLNO,ROWNO);
	
	ret = domove(dx, dy, dz);
	
	flags.nopick = 0;
	return ret;
}